

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::NegatePropagateStatistics::Operation<short>
               (LogicalType *type,BaseStatistics *istats,Value *new_min,Value *new_max)

{
  short input;
  short input_00;
  short sVar1;
  Value local_70;
  
  input = NumericStats::GetMax<short>(istats);
  input_00 = NumericStats::GetMin<short>(istats);
  if (input != -0x8000 && input_00 != -0x8000) {
    sVar1 = NegateOperator::Operation<short,short>(input);
    Value::Numeric(&local_70,type,(long)sVar1);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    sVar1 = NegateOperator::Operation<short,short>(input_00);
    Value::Numeric(&local_70,type,(long)sVar1);
    Value::operator=(new_max,&local_70);
    Value::~Value(&local_70);
  }
  return input == -0x8000 || input_00 == -0x8000;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &istats, Value &new_min, Value &new_max) {
		auto max_value = NumericStats::GetMax<T>(istats);
		auto min_value = NumericStats::GetMin<T>(istats);
		if (!NegateOperator::CanNegate<T>(min_value) || !NegateOperator::CanNegate<T>(max_value)) {
			return true;
		}
		// new min is -max
		new_min = Value::Numeric(type, NegateOperator::Operation<T, T>(max_value));
		// new max is -min
		new_max = Value::Numeric(type, NegateOperator::Operation<T, T>(min_value));
		return false;
	}